

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gal2icrs.cpp
# Opt level: O3

void PrintResults(CESkyCoord *input,CESkyCoord *output)

{
  double dVar1;
  double dVar2;
  undefined4 uVar3;
  vector<double,_std::allocator<double>_> out_dms;
  vector<double,_std::allocator<double>_> out_hms;
  CEAngle aCStack_a8 [16];
  CEDate local_98 [64];
  void *local_58 [3];
  double local_40;
  double *local_38;
  
  CEDate::CEDate((CEDate *)0x4142b42c80000000,local_98,0);
  (**(code **)(*(long *)output + 0x18))(local_58,output,local_98);
  CEAngle::HmsVect();
  CEAngle::~CEAngle((CEAngle *)local_58);
  CEDate::~CEDate(local_98);
  CEDate::CEDate((CEDate *)0x4142b42c80000000,local_98,0);
  (**(code **)(*(long *)output + 0x20))(aCStack_a8,output,local_98);
  CEAngle::DmsVect();
  CEAngle::~CEAngle(aCStack_a8);
  CEDate::~CEDate(local_98);
  putchar(10);
  puts("******************************************");
  puts("* Results of Galactic -> ICRS conversion *");
  puts("******************************************");
  puts("ICRS Coordinates (output)");
  dVar1 = *local_38;
  dVar2 = local_38[1];
  local_40 = local_38[2] + local_38[3];
  CEDate::CEDate((CEDate *)0x4142b42c80000000,local_98,0);
  (**(code **)(*(long *)output + 0x18))(aCStack_a8,output,local_98);
  uVar3 = CEAngle::Deg();
  printf("    Right Ascension: %02dh %02dm %04.1fs (%f deg)\n",local_40,uVar3,
         (ulong)(uint)(int)dVar1,(ulong)(uint)(int)dVar2);
  CEAngle::~CEAngle(aCStack_a8);
  CEDate::~CEDate(local_98);
  CEDate::CEDate((CEDate *)0x4142b42c80000000,local_98,0);
  (**(code **)(*(long *)input + 0x20))(aCStack_a8,input,local_98);
  CEAngle::Deg();
  printf("    Declination    : %+f degrees\n");
  CEAngle::~CEAngle(aCStack_a8);
  CEDate::~CEDate(local_98);
  puts("Galactic Coordinates (input)");
  CEDate::CEDate((CEDate *)0x4142b42c80000000,local_98,0);
  (**(code **)(*(long *)input + 0x18))(aCStack_a8,input,local_98);
  CEAngle::Deg();
  printf("    Galactic Lon.: %f degrees\n");
  CEAngle::~CEAngle(aCStack_a8);
  CEDate::~CEDate(local_98);
  CEDate::CEDate((CEDate *)0x4142b42c80000000,local_98,0);
  (**(code **)(*(long *)input + 0x20))(aCStack_a8,input,local_98);
  CEAngle::Deg();
  printf("    Galactic Lat.: %+f degrees\n");
  CEAngle::~CEAngle(aCStack_a8);
  CEDate::~CEDate(local_98);
  putchar(10);
  if (local_58[0] != (void *)0x0) {
    operator_delete(local_58[0]);
  }
  if (local_38 != (double *)0x0) {
    operator_delete(local_38);
  }
  return;
}

Assistant:

void PrintResults(const CESkyCoord& input,
                  const CESkyCoord& output)
{
    // Get the representation of the input icrs in hours, minutes, seconds
    std::vector<double> out_hms = output.XCoord().HmsVect();
    std::vector<double> out_dms = output.YCoord().DmsVect();
    
    std::printf("\n");
    std::printf("******************************************\n");
    std::printf("* Results of Galactic -> ICRS conversion *\n");
    std::printf("******************************************\n");
    std::printf("ICRS Coordinates (output)\n");
    std::printf("    Right Ascension: %02dh %02dm %04.1fs (%f deg)\n",
                int(out_hms[0]), int(out_hms[1]), out_hms[2]+out_hms[3],
                output.XCoord().Deg());
    std::printf("    Declination    : %+f degrees\n", input.YCoord().Deg());
    std::printf("Galactic Coordinates (input)\n");
    std::printf("    Galactic Lon.: %f degrees\n", input.XCoord().Deg());
    std::printf("    Galactic Lat.: %+f degrees\n", input.YCoord().Deg());
    std::printf("\n");
}